

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O1

void decode_nvrm_ioctl_create_drv_obj(nvrm_ioctl_create_drv_obj *s)

{
  FILE *__stream;
  char *pcVar1;
  
  fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)s->cid);
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%shandle: 0x%08x",nvrm_sep,(ulong)s->handle);
  nvrm_pfx = nvrm_sep;
  describe_nvrm_object(s->cid,s->handle,"handle");
  fprintf(_stdout,"%sclass: 0x%04x",nvrm_pfx,(ulong)s->cls);
  pcVar1 = nvrm_get_class_name(s->cls);
  if (pcVar1 != (char *)0x0) {
    fprintf(_stdout," [%s]",pcVar1);
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%sparent: 0x%08x",nvrm_sep,(ulong)s->parent);
  nvrm_pfx = nvrm_sep;
  describe_nvrm_object(s->cid,s->parent,"parent");
  __stream = _stdout;
  pcVar1 = nvrm_pfx;
  nvrm_status(s->status);
  fprintf(__stream,"%sstatus: %s",pcVar1,nvrm_status::buf);
  nvrm_pfx = nvrm_sep;
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_create_drv_obj(struct nvrm_ioctl_create_drv_obj *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_class(s, cls);
	nvrm_print_handle(s, parent, cid);
	nvrm_print_status(s, status);
	nvrm_print_ln();
}